

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O1

void __thiscall
QSharedDataPointer<QStyleSheetOutlineData>::detach_helper
          (QSharedDataPointer<QStyleSheetOutlineData> *this)

{
  QStyleSheetOutlineData *pQVar1;
  QStyleSheetBorderImageData *pQVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  QSize QVar5;
  QSize QVar6;
  QSize QVar7;
  QStyleSheetOutlineData *pQVar8;
  long lVar9;
  
  pQVar8 = (QStyleSheetOutlineData *)operator_new(0x80);
  pQVar1 = (this->d).ptr;
  (pQVar8->super_QStyleSheetBorderData).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value = (Type)0x0;
  uVar3 = *(undefined8 *)((pQVar1->super_QStyleSheetBorderData).borders + 2);
  *(undefined8 *)(pQVar8->super_QStyleSheetBorderData).borders =
       *(undefined8 *)(pQVar1->super_QStyleSheetBorderData).borders;
  *(undefined8 *)((pQVar8->super_QStyleSheetBorderData).borders + 2) = uVar3;
  lVar9 = 0x18;
  do {
    QBrush::QBrush((QBrush *)((long)(pQVar8->super_QStyleSheetBorderData).borders + lVar9 + -4),
                   (QBrush *)((long)(pQVar1->super_QStyleSheetBorderData).borders + lVar9 + -4));
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x38);
  uVar3 = *(undefined8 *)(pQVar1->super_QStyleSheetBorderData).styles;
  uVar4 = *(undefined8 *)((pQVar1->super_QStyleSheetBorderData).styles + 2);
  QVar5 = (pQVar1->super_QStyleSheetBorderData).radii[0];
  QVar6 = (pQVar1->super_QStyleSheetBorderData).radii[1];
  QVar7 = (pQVar1->super_QStyleSheetBorderData).radii[3];
  (pQVar8->super_QStyleSheetBorderData).radii[2] = (pQVar1->super_QStyleSheetBorderData).radii[2];
  (pQVar8->super_QStyleSheetBorderData).radii[3] = QVar7;
  (pQVar8->super_QStyleSheetBorderData).radii[0] = QVar5;
  (pQVar8->super_QStyleSheetBorderData).radii[1] = QVar6;
  *(undefined8 *)(pQVar8->super_QStyleSheetBorderData).styles = uVar3;
  *(undefined8 *)((pQVar8->super_QStyleSheetBorderData).styles + 2) = uVar4;
  pQVar2 = (pQVar1->super_QStyleSheetBorderData).bi.d.ptr;
  (pQVar8->super_QStyleSheetBorderData).bi.d.ptr = pQVar2;
  if (pQVar2 != (QStyleSheetBorderImageData *)0x0) {
    LOCK();
    (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  uVar3 = *(undefined8 *)(pQVar1->offsets + 2);
  *(undefined8 *)pQVar8->offsets = *(undefined8 *)pQVar1->offsets;
  *(undefined8 *)(pQVar8->offsets + 2) = uVar3;
  LOCK();
  (pQVar8->super_QStyleSheetBorderData).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value =
       (Type)((int)(pQVar8->super_QStyleSheetBorderData).super_QSharedData.ref.
                   super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QStyleSheetBorderData).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value =
       (Type)((int)(pQVar1->super_QStyleSheetBorderData).super_QSharedData.ref.
                   super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
  UNLOCK();
  if (((__atomic_base<int>)
       *(__int_type *)
        &(pQVar1->super_QStyleSheetBorderData).super_QSharedData.ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) &&
     (pQVar1 = (this->d).ptr, pQVar1 != (QStyleSheetOutlineData *)0x0)) {
    QSharedDataPointer<QStyleSheetBorderImageData>::~QSharedDataPointer
              (&(pQVar1->super_QStyleSheetBorderData).bi);
    lVar9 = 0x30;
    do {
      QBrush::~QBrush((QBrush *)((long)(pQVar1->super_QStyleSheetBorderData).borders + lVar9 + -4));
      lVar9 = lVar9 + -8;
    } while (lVar9 != 0x10);
    operator_delete(pQVar1,0x80);
  }
  (this->d).ptr = pQVar8;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}